

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> * __thiscall
wallet::DescriptorScriptPubKeyMan::GetKeys(DescriptorScriptPubKeyMan *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *crypted_secret;
  CPubKey *pubkey;
  pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *key_pair;
  CryptedKeyMap *__range2;
  KeyMap *keys;
  CKey key;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  mapped_type *in_stack_ffffffffffffff10;
  CKey *in_stack_ffffffffffffff18;
  anon_class_24_3_381b3de6 *__f;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> *this_00;
  undefined1 local_60 [32];
  CKey local_40;
  _Base_ptr local_30;
  _Base_ptr local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (&in_stack_ffffffffffffff18->fCompressed,&in_stack_ffffffffffffff10->fCompressed,
             in_stack_ffffffffffffff0c,(AnnotatedMixin<std::recursive_mutex> *)0x402f8c);
  uVar2 = (**(code **)(**(long **)(in_RSI + 8) + 0x48))();
  if (((uVar2 & 1) == 0) ||
     (uVar2 = (**(code **)(**(long **)(in_RSI + 8) + 0x50))(), (uVar2 & 1) != 0)) {
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::map
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)0x4031a9);
  }
  else {
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::map
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_28 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff10);
    local_30 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      *)in_stack_ffffffffffffff10);
    while (bVar1 = std::operator==((_Self *)in_stack_ffffffffffffff18,
                                   (_Self *)in_stack_ffffffffffffff10), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      in_stack_ffffffffffffff18 = &local_40;
      CKey::CKey((CKey *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      __f = *(anon_class_24_3_381b3de6 **)(in_RSI + 8);
      std::function<bool(std::vector<unsigned_char,secure_allocator<unsigned_char>>const&)>::
      function<wallet::DescriptorScriptPubKeyMan::GetKeys()const::__0,void>(in_RDI,__f);
      (*(code *)__f->crypted_secret[2].
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)(__f,local_60);
      std::function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>::
      ~function((function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
                 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      CPubKey::GetID((CPubKey *)this_00);
      in_stack_ffffffffffffff10 =
           std::
           map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
           operator[]((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                       *)this_00,(key_type *)in_RDI);
      CKey::operator=(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      CKey::~CKey((CKey *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *)
           this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::map<CKeyID, CKey> DescriptorScriptPubKeyMan::GetKeys() const
{
    AssertLockHeld(cs_desc_man);
    if (m_storage.HasEncryptionKeys() && !m_storage.IsLocked()) {
        KeyMap keys;
        for (const auto& key_pair : m_map_crypted_keys) {
            const CPubKey& pubkey = key_pair.second.first;
            const std::vector<unsigned char>& crypted_secret = key_pair.second.second;
            CKey key;
            m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
                return DecryptKey(encryption_key, crypted_secret, pubkey, key);
            });
            keys[pubkey.GetID()] = key;
        }
        return keys;
    }
    return m_map_keys;
}